

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

time_point NodeClock::now(void)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  rep rVar4;
  seconds __lhs;
  long in_FS_OFFSET;
  duration ret;
  duration<long,_std::ratio<1L,_1L>_> mocktime;
  __unspec *in_stack_ffffffffffffff98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined8 in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  duration local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::load
            ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,
                      CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),
             (memory_order)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff98);
  if (rVar4 == 0) {
    std::chrono::_V2::system_clock::now();
    std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_since_epoch(in_stack_ffffffffffffffa0);
  }
  else {
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              (&in_stack_ffffffffffffffa0->__d,
               (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff98);
  }
  __lhs = s<(char)48>();
  sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)__lhs.__r,
                     (duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffff98,(__unspec *)0x1f6ace);
  bVar3 = std::operator>(sVar2._M_value);
  if (!bVar3) {
    __assert_fail("ret > 0s",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/time.cpp"
                  ,0x1c,"static NodeClock::time_point NodeClock::now()");
  }
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
  time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
             in_stack_ffffffffffffff98,(duration *)0x1f6b0e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (time_point)(duration)local_10.__r;
  }
  __stack_chk_fail();
}

Assistant:

NodeClock::time_point NodeClock::now() noexcept
{
    const auto mocktime{g_mock_time.load(std::memory_order_relaxed)};
    const auto ret{
        mocktime.count() ?
            mocktime :
            std::chrono::system_clock::now().time_since_epoch()};
    assert(ret > 0s);
    return time_point{ret};
}